

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckRange
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  AActor *pAVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  AActor *self;
  AActor **obj;
  double range;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003e5516;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e5506:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e5516:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe22,
                  "int AF_AActor_CheckRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003e5377;
    bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e5516;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003e5506;
LAB_003e5377:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      pVVar1 = param + 1;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003e53cf;
        pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003e53cf:
          obj = (AActor **)&DAT_017dc0f8;
          iVar6 = param[2].field_0.i;
          range = (pVVar1->field_0).f * (pVVar1->field_0).f;
          lVar4 = 0;
          do {
            if (lVar4 == 8) {
              if (numret < 1) {
LAB_003e54f3:
                iVar5 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0xe38,
                                "int AF_AActor_CheckRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                iVar6 = 1;
LAB_003e54b9:
                iVar5 = 1;
                VMReturn::SetInt(ret,iVar6);
              }
              return iVar5;
            }
            if (playeringame[lVar4] == true) {
              bVar2 = DoCheckSightOrRange(self,obj[-0x2f],range,iVar6 != 0,false);
              if (bVar2) {
                if (numret < 1) goto LAB_003e54f3;
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0xe2e,
                                "int AF_AActor_CheckRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
LAB_003e54b7:
                iVar6 = 0;
                goto LAB_003e54b9;
              }
              pAVar3 = GC::ReadBarrier<AActor>(obj);
              if (pAVar3 != (AActor *)0x0) {
                pAVar3 = GC::ReadBarrier<AActor>(obj);
                if (pAVar3->player == (player_t *)0x0) {
                  pAVar3 = GC::ReadBarrier<AActor>(obj);
                  bVar2 = DoCheckSightOrRange(self,pAVar3,range,iVar6 != 0,false);
                  if (bVar2) {
                    if (0 < numret) {
                      if (ret == (VMReturn *)0x0) {
                        __assert_fail("ret != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                      ,0xe34,
                                      "int AF_AActor_CheckRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                     );
                      }
                      goto LAB_003e54b7;
                    }
                    goto LAB_003e54f3;
                  }
                }
              }
            }
            lVar4 = lVar4 + 1;
            obj = obj + 0x54;
          } while( true );
        }
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe24,
                    "int AF_AActor_CheckRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe23,
                "int AF_AActor_CheckRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckRange)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(range);
	PARAM_BOOL_DEF(twodi);

	range *= range;
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			// Always check from each player.
			if (DoCheckSightOrRange(self, players[i].mo, range, twodi, false))
			{
				ACTION_RETURN_BOOL(false);
			}
			// If a player is viewing from a non-player, check that too.
			if (players[i].camera != NULL && players[i].camera->player == NULL &&
				DoCheckSightOrRange(self, players[i].camera, range, twodi, false))
			{
				ACTION_RETURN_BOOL(false);
			}
		}
	}
	ACTION_RETURN_BOOL(true);
}